

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proposal.cpp
# Opt level: O1

int __thiscall
ncnn::Proposal::forward
          (Proposal *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  undefined4 uVar5;
  uint _c;
  long lVar6;
  Mat *this_00;
  size_t sVar7;
  size_t sVar8;
  pointer pMVar9;
  int *piVar10;
  pointer pRVar11;
  pointer pRVar12;
  undefined1 (*pauVar13) [16];
  void *pvVar14;
  float *pfVar15;
  int iVar16;
  long lVar17;
  ulong uVar18;
  Rect *pRVar19;
  ulong uVar20;
  long lVar21;
  undefined1 (*pauVar22) [16];
  void *pvVar23;
  void *pvVar24;
  void *pvVar25;
  float *__args;
  int _c_00;
  ulong uVar26;
  bool bVar27;
  float fVar28;
  float fVar29;
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> proposal_boxes;
  vector<unsigned_long,_std::allocator<unsigned_long>_> picked;
  vector<float,_std::allocator<float>_> scores;
  Rect r;
  vector<ncnn::Rect,_std::allocator<ncnn::Rect>_> local_238;
  unsigned_long local_218;
  uint local_20c;
  void *local_208;
  iterator iStack_200;
  unsigned_long *local_1f8;
  vector<float,_std::allocator<float>_> local_1e8;
  pointer local_1c8;
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  pointer local_1b0;
  ulong local_1a8;
  undefined1 (*local_1a0) [16];
  ulong local_198;
  float local_190;
  float local_18c;
  float local_188;
  undefined4 uStack_184;
  undefined4 uStack_180;
  undefined4 uStack_17c;
  Mat local_178;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_130;
  void *local_128;
  void *local_120;
  undefined1 (*local_118) [16];
  void *local_110;
  void *local_108;
  ulong local_100;
  void *local_f8;
  ulong local_f0;
  ulong local_e8;
  long local_e0;
  long local_d8;
  long local_d0;
  long local_c8;
  long local_c0;
  long local_b8;
  ulong local_b0;
  ulong local_a8;
  void *local_a0;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  float local_58;
  undefined1 local_48 [24];
  
  local_1c8 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
              super__Vector_impl_data._M_start;
  local_f0 = (ulong)local_1c8->w;
  local_e8 = (ulong)(uint)local_1c8->h;
  _c = (this->anchors).h;
  local_178.cstep = 0;
  local_20c = local_1c8->h * local_1c8->w;
  local_178.data = (undefined1 (*) [16])0x0;
  local_178.refcount._0_4_ = 0;
  local_178.refcount._4_4_ = 0;
  local_178.elemsize._0_4_ = 0;
  local_178.elemsize._4_4_ = 0;
  local_178.elempack = 0;
  local_178.allocator = (Allocator *)0x0;
  local_178.dims = 0;
  local_178.w = 0;
  local_178.h = 0;
  local_178.d = 0;
  local_178.c = 0;
  local_130 = top_blobs;
  Mat::create(&local_178,4,local_20c,_c,4,(Allocator *)0x0);
  local_100 = (ulong)_c;
  if (0 < (int)_c) {
    local_a8 = local_f0 & 0xffffffff;
    local_108 = local_1c8[1].data;
    lVar21 = local_1c8[1].cstep * local_1c8[1].elemsize;
    local_118 = (undefined1 (*) [16])local_178.data;
    local_f8 = (this->anchors).data;
    local_190 = (float)this->feat_stride;
    local_e0 = (long)(this->anchors).w * (this->anchors).elemsize;
    local_d0 = local_178.cstep * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
    lVar17 = (long)local_178.w * CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
    local_b8 = lVar17 * local_a8;
    local_120 = (void *)(lVar21 * 3 + (long)local_108);
    local_d8 = lVar21 * 4;
    local_c0 = local_f0 * 4;
    local_128 = (void *)((long)local_108 + lVar21 * 2);
    local_110 = (void *)(lVar21 + (long)local_108);
    local_1a8 = 0;
    do {
      if (0 < (int)local_e8) {
        local_c8 = local_e0 * local_1a8;
        fVar28 = (float)((ulong)*(undefined8 *)((long)local_f8 + local_c8) >> 0x20);
        uVar4 = *(undefined8 *)((long)local_f8 + local_c8 + 8);
        fVar32 = (float)uVar4 - (float)*(undefined8 *)((long)local_f8 + local_c8);
        fVar34 = (float)((ulong)uVar4 >> 0x20) - fVar28;
        fStack_80 = fVar32 * 0.5;
        fStack_7c = fVar34 * 0.5;
        local_18c = (float)this->feat_stride;
        local_1a0 = local_118;
        uVar26 = 0;
        local_78 = CONCAT44(fVar34,fVar32);
        uStack_70 = 0;
        pvVar14 = local_108;
        pvVar23 = local_120;
        pvVar24 = local_110;
        pvVar25 = local_128;
        fVar29 = fVar28;
        fVar33 = fVar28;
        fVar31 = fVar28;
        local_98 = fVar34;
        fStack_94 = fVar34;
        fStack_90 = fVar34;
        fStack_8c = fVar34;
        do {
          local_b0 = uVar26;
          if (0 < (int)local_f0) {
            fVar35 = *(float *)((long)local_f8 + local_c8);
            uStack_184 = 0;
            uStack_180 = 0;
            uStack_17c = 0;
            uVar26 = 0;
            pauVar13 = local_1a0;
            local_a0 = pvVar23;
            local_68 = fVar28;
            fStack_64 = fVar29;
            fStack_60 = fVar33;
            fStack_5c = fVar31;
            do {
              local_198 = CONCAT44(local_198._4_4_,*(undefined4 *)((long)local_a0 + uVar26 * 4));
              local_48._4_4_ = 0;
              local_48._0_4_ = (*(float *)((long)pvVar24 + uVar26 * 4) + 0.5) * fVar34;
              local_48._8_4_ = (*(float *)((long)pvVar14 + uVar26 * 4) + 0.5) * fVar32;
              local_48._12_4_ = 0;
              local_188 = fVar35;
              local_58 = expf(*(float *)((long)pvVar25 + uVar26 * 4));
              fVar28 = expf((float)local_198);
              *(float *)*pauVar13 = ((float)local_48._8_4_ + local_188) - local_58 * fStack_80;
              *(float *)(*pauVar13 + 4) = ((float)local_48._0_4_ + local_68) - fVar28 * fStack_7c;
              *(float *)(*pauVar13 + 8) = (float)local_48._8_4_ + local_188 + local_58 * fStack_80;
              *(float *)(*pauVar13 + 0xc) = (float)local_48._0_4_ + local_68 + fVar28 * fStack_7c;
              fVar35 = local_188 + local_18c;
              uVar26 = uVar26 + 1;
              pauVar13 = (undefined1 (*) [16])(*pauVar13 + lVar17);
              pvVar23 = local_a0;
              fVar28 = local_68;
              fVar29 = fStack_64;
              fVar33 = fStack_60;
              fVar31 = fStack_5c;
              fVar32 = (float)local_78;
              fVar34 = local_98;
            } while (local_a8 != uVar26);
          }
          fVar28 = fVar28 + local_190;
          uVar26 = local_b0 + 1;
          local_1a0 = (undefined1 (*) [16])(*local_1a0 + local_b8);
          pvVar23 = (void *)((long)pvVar23 + local_c0);
          pvVar25 = (void *)((long)pvVar25 + local_c0);
          pvVar24 = (void *)((long)pvVar24 + local_c0);
          pvVar14 = (void *)((long)pvVar14 + local_c0);
        } while (uVar26 != local_e8);
      }
      local_1a8 = local_1a8 + 1;
      local_118 = (undefined1 (*) [16])(*local_118 + local_d0);
      local_120 = (void *)((long)local_120 + local_d8);
      local_128 = (void *)((long)local_128 + local_d8);
      local_110 = (void *)((long)local_110 + local_d8);
      local_108 = (void *)((long)local_108 + local_d8);
    } while (local_1a8 != local_100);
  }
  local_198 = (ulong)local_20c;
  if (0 < (int)local_100) {
    fVar28 = (float)*local_1c8[2].data;
    fVar29 = (float)((ulong)*local_1c8[2].data >> 0x20);
    uVar26 = 0;
    pauVar13 = (undefined1 (*) [16])local_178.data;
    do {
      uVar20 = local_198;
      pauVar22 = pauVar13;
      if (0 < (int)local_20c) {
        do {
          auVar30._4_4_ = fVar28 + -1.0;
          auVar30._0_4_ = fVar29 + -1.0;
          auVar30._8_4_ = fVar29 + -1.0;
          auVar30._12_4_ = fVar28 + -1.0;
          auVar30 = minps(*pauVar22,auVar30);
          auVar30 = maxps(auVar30,ZEXT816(0));
          *pauVar22 = auVar30;
          pauVar22 = (undefined1 (*) [16])
                     (*pauVar22 +
                     (long)local_178.w *
                     CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize));
          uVar20 = uVar20 - 1;
        } while (uVar20 != 0);
      }
      uVar26 = uVar26 + 1;
      pauVar13 = (undefined1 (*) [16])
                 (*pauVar13 +
                 CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize) * local_178.cstep
                 );
    } while (uVar26 != local_100);
  }
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_start = (Rect *)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_finish = (Rect *)0x0;
  local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (Rect *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (float *)0x0;
  local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  if (0 < (int)local_100) {
    local_188 = (float)this->min_size * *(float *)((long)local_1c8[2].data + 8);
    uVar20 = 0;
    uVar26 = local_100;
    do {
      if (0 < (int)local_20c) {
        lVar17 = CONCAT44(local_178.elemsize._4_4_,(undefined4)local_178.elemsize);
        lVar21 = (long)local_178.w;
        __args = (float *)(local_1c8->elemsize * local_1c8->cstep * uVar26 + (long)local_1c8->data);
        pfVar15 = (float *)((undefined1 *)local_178.data + local_178.cstep * lVar17 * uVar20 + 0xc);
        uVar18 = local_198;
        do {
          if ((local_188 <= (pfVar15[-1] + 1.0) - pfVar15[-3]) &&
             (local_188 <= (*pfVar15 + 1.0) - pfVar15[-2])) {
            pfVar1 = pfVar15 + -3;
            local_1c0._0_4_ = *pfVar1;
            local_1c0._4_4_ = pfVar15[-2];
            fVar28 = pfVar1[1];
            fStack_1b8 = pfVar15[-1];
            fStack_1b4 = *pfVar15;
            if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<ncnn::Rect,std::allocator<ncnn::Rect>>::
              _M_realloc_insert<ncnn::Rect_const&>
                        ((vector<ncnn::Rect,std::allocator<ncnn::Rect>> *)&local_238,
                         (iterator)
                         local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(Rect *)local_1c0);
            }
            else {
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x1 = pfVar1[0];
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y1 = fVar28;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->x2 = fStack_1b8;
              (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
               super__Vector_impl_data._M_finish)->y2 = fStack_1b4;
              local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<float,std::allocator<float>>::_M_realloc_insert<float_const&>
                        ((vector<float,std::allocator<float>> *)&local_1e8,
                         (iterator)
                         local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish,__args);
            }
            else {
              *local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish = *__args;
              local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          __args = __args + 1;
          pfVar15 = (float *)((long)pfVar15 + lVar21 * lVar17);
          uVar18 = uVar18 - 1;
        } while (uVar18 != 0);
      }
      uVar20 = uVar20 + 1;
      uVar26 = uVar26 + 1;
    } while (uVar20 != local_100);
  }
  if ((local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
       super__Vector_impl_data._M_start !=
       local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
       super__Vector_impl_data._M_finish) &&
     (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish)) {
    qsort_descent_inplace<ncnn::Rect>
              (&local_238,&local_1e8,0,
               (int)((ulong)((long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 2) + -1);
  }
  iVar16 = this->pre_nms_topN;
  if ((0 < (long)iVar16) &&
     (iVar16 < (int)((ulong)((long)local_238.
                                   super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                            (long)local_238.
                                  super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                                  _M_impl.super__Vector_impl_data._M_start) >> 4))) {
    std::vector<ncnn::Rect,_std::allocator<ncnn::Rect>_>::resize(&local_238,(long)iVar16);
    std::vector<float,_std::allocator<float>_>::resize(&local_1e8,(long)this->pre_nms_topN);
  }
  pRVar12 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_finish;
  pRVar11 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_208 = (void *)0x0;
  local_1f8 = (unsigned_long *)0x0;
  iStack_200._M_current = (unsigned_long *)0x0;
  local_188 = this->nms_thresh;
  uVar26 = (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                 super__Vector_impl_data._M_start >> 4;
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_1c0,uVar26,(allocator_type *)&local_218)
  ;
  if (pRVar12 == pRVar11) {
    local_218 = 0;
  }
  else {
    pfVar15 = &(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                super__Vector_impl_data._M_start)->x2;
    lVar17 = 0;
    do {
      uVar3 = ((Rect *)(pfVar15 + -2))->x1;
      uVar5 = ((Rect *)(pfVar15 + -2))->y1;
      *(float *)(CONCAT44(local_1c0._4_4_,local_1c0._0_4_) + lVar17 * 4) =
           ((float)((ulong)*(undefined8 *)pfVar15 >> 0x20) - (float)uVar5) *
           ((float)*(undefined8 *)pfVar15 - (float)uVar3);
      lVar17 = lVar17 + 1;
      pfVar15 = pfVar15 + 4;
    } while (uVar26 + (uVar26 == 0) != lVar17);
    local_218 = 0;
    if (pRVar12 != pRVar11) {
      do {
        if ((long)iStack_200._M_current - (long)local_208 == 0) {
LAB_0035852b:
          if (iStack_200._M_current == local_1f8) {
            std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long_const&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_208,iStack_200,
                       &local_218);
          }
          else {
            *iStack_200._M_current = local_218;
            iStack_200._M_current = iStack_200._M_current + 1;
          }
        }
        else {
          lVar17 = (long)iStack_200._M_current - (long)local_208 >> 3;
          fVar28 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[local_218].x1;
          bVar27 = true;
          lVar21 = 0;
          do {
            lVar6 = *(long *)((long)local_208 + lVar21 * 8);
            fVar29 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar6].x2;
            fVar33 = 0.0;
            if (fVar28 <= fVar29) {
              pRVar19 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar6;
              fVar31 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl
                       .super__Vector_impl_data._M_start[local_218].x2;
              fVar32 = pRVar19->x1;
              if (fVar32 <= fVar31) {
                fVar34 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                         _M_impl.super__Vector_impl_data._M_start[local_218].y1;
                fVar35 = pRVar19->y2;
                if (fVar34 <= fVar35) {
                  fVar2 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start[local_218].y2;
                  fVar36 = pRVar19->y1;
                  if (fVar36 <= fVar2) {
                    if (fVar31 <= fVar29) {
                      fVar29 = fVar31;
                    }
                    if (fVar32 <= fVar28) {
                      fVar32 = fVar28;
                    }
                    if (fVar2 <= fVar35) {
                      fVar35 = fVar2;
                    }
                    if (fVar36 <= fVar34) {
                      fVar36 = fVar34;
                    }
                    fVar33 = (fVar35 - fVar36) * (fVar29 - fVar32);
                  }
                }
              }
            }
            if (local_188 <
                fVar33 / ((*(float *)(CONCAT44(local_1c0._4_4_,local_1c0._0_4_) + local_218 * 4) -
                          fVar33) +
                         *(float *)(CONCAT44(local_1c0._4_4_,local_1c0._0_4_) + lVar6 * 4))) {
              bVar27 = false;
            }
            lVar21 = lVar21 + 1;
          } while (lVar17 + (ulong)(lVar17 == 0) != lVar21);
          if (bVar27) goto LAB_0035852b;
        }
        local_218 = local_218 + 1;
      } while (local_218 < uVar26);
    }
  }
  pvVar14 = (void *)CONCAT44(local_1c0._4_4_,local_1c0._0_4_);
  if (pvVar14 != (void *)0x0) {
    operator_delete(pvVar14,(long)local_1b0 - (long)pvVar14);
  }
  uVar26 = (ulong)((long)iStack_200._M_current - (long)local_208) >> 3;
  uVar20 = uVar26 & 0xffffffff;
  if (this->after_nms_topN < (int)uVar26) {
    uVar20 = (ulong)(uint)this->after_nms_topN;
  }
  this_00 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _c_00 = (int)uVar20;
  Mat::create(this_00,4,1,_c_00,4,(Allocator *)0x0);
  iVar16 = -100;
  if ((this_00->data != (void *)0x0) && ((long)this_00->c * this_00->cstep != 0)) {
    if (0 < _c_00) {
      sVar7 = this_00->cstep;
      sVar8 = this_00->elemsize;
      pfVar15 = (float *)((long)this_00->data + 0xc);
      uVar26 = 0;
      do {
        lVar17 = *(long *)((long)local_208 + uVar26 * 8);
        pfVar15[-3] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17].x1;
        pfVar15[-2] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17].y1;
        pfVar15[-1] = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar17].x2;
        *pfVar15 = local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar17].y2;
        uVar26 = uVar26 + 1;
        pfVar15 = (float *)((long)pfVar15 + sVar7 * sVar8);
      } while (uVar20 != uVar26);
    }
    pMVar9 = (local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (1 < (ulong)(((long)(local_130->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                           _M_impl.super__Vector_impl_data._M_finish - (long)pMVar9 >> 3) *
                   -0x71c71c71c71c71c7)) {
      Mat::create(pMVar9 + 1,1,1,_c_00,4,(Allocator *)0x0);
      if (pMVar9[1].data == (void *)0x0) {
        bVar27 = true;
      }
      else {
        bVar27 = (long)pMVar9[1].c * pMVar9[1].cstep == 0;
      }
      if (bVar27) goto LAB_00358710;
      if (0 < _c_00) {
        pfVar15 = (float *)pMVar9[1].data;
        sVar7 = pMVar9[1].cstep;
        sVar8 = pMVar9[1].elemsize;
        uVar26 = 0;
        do {
          *pfVar15 = local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[*(long *)((long)local_208 + uVar26 * 8)];
          uVar26 = uVar26 + 1;
          pfVar15 = (float *)((long)pfVar15 + sVar7 * sVar8);
        } while (uVar20 != uVar26);
      }
    }
    iVar16 = 0;
  }
LAB_00358710:
  if (local_208 != (void *)0x0) {
    operator_delete(local_208,(long)local_1f8 - (long)local_208);
  }
  if (local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (float *)0x0) {
    operator_delete(local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
      super__Vector_impl_data._M_start != (Rect *)0x0) {
    operator_delete(local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_238.super__Vector_base<ncnn::Rect,_std::allocator<ncnn::Rect>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  piVar10 = (int *)CONCAT44(local_178.refcount._4_4_,local_178.refcount._0_4_);
  if (piVar10 != (int *)0x0) {
    LOCK();
    *piVar10 = *piVar10 + -1;
    UNLOCK();
    if (*piVar10 == 0) {
      if (local_178.allocator == (Allocator *)0x0) {
        if ((undefined1 (*) [16])local_178.data != (undefined1 (*) [16])0x0) {
          free(local_178.data);
        }
      }
      else {
        (*(local_178.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar16;
}

Assistant:

int Proposal::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& score_blob = bottom_blobs[0];
    const Mat& bbox_blob = bottom_blobs[1];
    const Mat& im_info_blob = bottom_blobs[2];

    int w = score_blob.w;
    int h = score_blob.h;

    // generate proposals from bbox deltas and shifted anchors
    const int num_anchors = anchors.h;

    Mat proposals;
    proposals.create(4, w * h, num_anchors);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        const float* bbox_xptr = bbox_blob.channel(q * 4);
        const float* bbox_yptr = bbox_blob.channel(q * 4 + 1);
        const float* bbox_wptr = bbox_blob.channel(q * 4 + 2);
        const float* bbox_hptr = bbox_blob.channel(q * 4 + 3);

        Mat pbs = proposals.channel(q);

        const float* anchor = anchors.row(q);

        // shifted anchor
        float anchor_y = anchor[1];

        float anchor_w = anchor[2] - anchor[0];
        float anchor_h = anchor[3] - anchor[1];

        for (int i = 0; i < h; i++)
        {
            float anchor_x = anchor[0];

            for (int j = 0; j < w; j++)
            {
                float* pb = pbs.row(i * w + j);

                // apply center size
                float dx = bbox_xptr[j];
                float dy = bbox_yptr[j];
                float dw = bbox_wptr[j];
                float dh = bbox_hptr[j];

                float cx = anchor_x + anchor_w * 0.5f;
                float cy = anchor_y + anchor_h * 0.5f;

                float pb_cx = cx + anchor_w * dx;
                float pb_cy = cy + anchor_h * dy;

                float pb_w = static_cast<float>(anchor_w * exp(dw));
                float pb_h = static_cast<float>(anchor_h * exp(dh));

                pb[0] = pb_cx - pb_w * 0.5f;
                pb[1] = pb_cy - pb_h * 0.5f;
                pb[2] = pb_cx + pb_w * 0.5f;
                pb[3] = pb_cy + pb_h * 0.5f;

                anchor_x += feat_stride;
            }

            bbox_xptr += w;
            bbox_yptr += w;
            bbox_wptr += w;
            bbox_hptr += w;

            anchor_y += feat_stride;
        }
    }

    // clip predicted boxes to image
    float im_w = im_info_blob[1];
    float im_h = im_info_blob[0];

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            // clip box
            pb[0] = std::max(std::min(pb[0], im_w - 1), 0.f);
            pb[1] = std::max(std::min(pb[1], im_h - 1), 0.f);
            pb[2] = std::max(std::min(pb[2], im_w - 1), 0.f);
            pb[3] = std::max(std::min(pb[3], im_h - 1), 0.f);
        }
    }

    // remove predicted boxes with either height or width < threshold
    std::vector<Rect> proposal_boxes;
    std::vector<float> scores;

    float im_scale = im_info_blob[2];
    float min_boxsize = min_size * im_scale;

    for (int q = 0; q < num_anchors; q++)
    {
        Mat pbs = proposals.channel(q);
        const float* scoreptr = score_blob.channel(q + num_anchors);

        for (int i = 0; i < w * h; i++)
        {
            float* pb = pbs.row(i);

            float pb_w = pb[2] - pb[0] + 1;
            float pb_h = pb[3] - pb[1] + 1;

            if (pb_w >= min_boxsize && pb_h >= min_boxsize)
            {
                Rect r = {pb[0], pb[1], pb[2], pb[3]};
                proposal_boxes.push_back(r);
                scores.push_back(scoreptr[i]);
            }
        }
    }

    // sort all (proposal, score) pairs by score from highest to lowest
    qsort_descent_inplace(proposal_boxes, scores);

    // take top pre_nms_topN
    if (pre_nms_topN > 0 && pre_nms_topN < (int)proposal_boxes.size())
    {
        proposal_boxes.resize(pre_nms_topN);
        scores.resize(pre_nms_topN);
    }

    // apply nms with nms_thresh
    std::vector<size_t> picked;
    nms_sorted_bboxes(proposal_boxes, picked, nms_thresh);

    // take after_nms_topN
    int picked_count = std::min((int)picked.size(), after_nms_topN);

    // return the top proposals
    Mat& roi_blob = top_blobs[0];
    roi_blob.create(4, 1, picked_count);
    if (roi_blob.empty())
        return -100;

    for (int i = 0; i < picked_count; i++)
    {
        float* outptr = roi_blob.channel(i);

        outptr[0] = proposal_boxes[picked[i]].x1;
        outptr[1] = proposal_boxes[picked[i]].y1;
        outptr[2] = proposal_boxes[picked[i]].x2;
        outptr[3] = proposal_boxes[picked[i]].y2;
    }

    if (top_blobs.size() > 1)
    {
        Mat& roi_score_blob = top_blobs[1];
        roi_score_blob.create(1, 1, picked_count);
        if (roi_score_blob.empty())
            return -100;

        for (int i = 0; i < picked_count; i++)
        {
            float* outptr = roi_score_blob.channel(i);
            outptr[0] = scores[picked[i]];
        }
    }

    return 0;
}